

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t * container_range_of_ones(uint32_t range_start,uint32_t range_end,uint8_t *result_type)

{
  uint stop;
  undefined1 *in_RDX;
  int in_ESI;
  int in_EDI;
  uint64_t cardinality;
  undefined8 local_8;
  
  stop = (in_ESI - in_EDI) + 1;
  if (stop < 3) {
    *in_RDX = 2;
    local_8 = array_container_create_range((uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX);
  }
  else {
    *in_RDX = 3;
    local_8 = (array_container_t *)run_container_create_range(0,stop);
  }
  return local_8;
}

Assistant:

static inline container_t *container_range_of_ones(uint32_t range_start,
                                                   uint32_t range_end,
                                                   uint8_t *result_type) {
    assert(range_end >= range_start);
    uint64_t cardinality = range_end - range_start + 1;
    if (cardinality <= 2) {
        *result_type = ARRAY_CONTAINER_TYPE;
        return array_container_create_range(range_start, range_end);
    } else {
        *result_type = RUN_CONTAINER_TYPE;
        return run_container_create_range(range_start, range_end);
    }
}